

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

int32 __thiscall rw::Frame::count(Frame *this)

{
  int32 local_14;
  Frame *pFStack_10;
  int32 count;
  Frame *this_local;
  
  local_14 = 1;
  pFStack_10 = this;
  forAllChildren(this,countCB,&local_14);
  return local_14;
}

Assistant:

int32
Frame::count(void)
{
	int32 count = 1;
	this->forAllChildren(countCB, (void*)&count);
	return count;
}